

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O0

void save_jpg_entry_helper(ALLEGRO_FILE *fp,ALLEGRO_BITMAP *bmp,save_jpg_entry_helper_data *data)

{
  int iVar1;
  undefined8 uVar2;
  char *__nptr;
  ulong uVar3;
  undefined1 *in_RDX;
  undefined8 in_RSI;
  uchar *row [1];
  char *level;
  ALLEGRO_LOCKED_REGION *lock;
  my_err_mgr jerr;
  jpeg_compress_struct cinfo;
  JOCTET *in_stack_fffffffffffffc10;
  ALLEGRO_FILE *in_stack_fffffffffffffc18;
  j_compress_ptr in_stack_fffffffffffffc20;
  code *local_3d0 [21];
  __jmp_buf_tag _Stack_328;
  undefined8 local_260 [6];
  undefined4 local_230;
  uint local_22c;
  undefined4 local_228;
  undefined4 local_224;
  uint local_10c;
  undefined1 *local_18;
  undefined8 local_10;
  
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_260[0] = jpeg_std_error(local_3d0);
  local_3d0[0] = my_error_exit;
  iVar1 = _setjmp(&_Stack_328);
  if (iVar1 == 0) {
    uVar2 = al_malloc_with_context
                      (0x1000,0x139,
                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                       ,"save_jpg_entry_helper");
    *(undefined8 *)(local_18 + 8) = uVar2;
    if (*(long *)(local_18 + 8) == 0) {
      *local_18 = 1;
    }
    else {
      jpeg_CreateCompress(local_260,0x50,0x248);
      jpeg_packfile_dest(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                         in_stack_fffffffffffffc10);
      local_230 = al_get_bitmap_width(local_10);
      local_22c = al_get_bitmap_height(local_10);
      local_228 = 3;
      local_224 = 2;
      jpeg_set_defaults(local_260);
      uVar2 = al_get_system_config();
      __nptr = (char *)al_get_config_value(uVar2,"image","jpeg_quality_level");
      if (__nptr == (char *)0x0) {
        uVar3 = 0x4b;
      }
      else {
        uVar3 = strtol(__nptr,(char **)0x0,10);
      }
      jpeg_set_quality(local_260,uVar3 & 0xffffffff,1);
      jpeg_start_compress(local_260,1);
      al_lock_bitmap(local_10,0x13,1);
      while (local_10c < local_22c) {
        jpeg_write_scanlines(local_260,&stack0xfffffffffffffc18,1);
      }
    }
    jpeg_finish_compress(local_260);
  }
  else {
    *local_18 = 1;
  }
  jpeg_destroy_compress(local_260);
  uVar3 = al_is_bitmap_locked(local_10);
  if ((uVar3 & 1) != 0) {
    al_unlock_bitmap(local_10);
  }
  al_free_with_context
            (*(undefined8 *)(local_18 + 8),0x167,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"save_jpg_entry_helper");
  return;
}

Assistant:

static void save_jpg_entry_helper(ALLEGRO_FILE *fp, ALLEGRO_BITMAP *bmp,
   struct save_jpg_entry_helper_data *data)
{
   struct jpeg_compress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv)) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_compress(&cinfo);
   jpeg_packfile_dest(&cinfo, fp, data->buffer);

   cinfo.image_width = al_get_bitmap_width(bmp);
   cinfo.image_height = al_get_bitmap_height(bmp);
   cinfo.input_components = 3;
   cinfo.in_color_space = JCS_RGB;
   jpeg_set_defaults(&cinfo);

   const char* level = al_get_config_value(al_get_system_config(), "image", "jpeg_quality_level");
   jpeg_set_quality(&cinfo, level ? strtol(level, NULL, 10) : 75, true);

   jpeg_start_compress(&cinfo, 1);

   /* See comment in load_jpg_entry_helper. */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
      ALLEGRO_LOCK_READONLY);
#else
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
      ALLEGRO_LOCK_READONLY);
#endif

   while (cinfo.next_scanline < cinfo.image_height) {
      unsigned char *row[1];
      row[0] = ((unsigned char *)lock->data)
         + (signed)cinfo.next_scanline * lock->pitch;
      jpeg_write_scanlines(&cinfo, (void *)row, 1);
   }

 error:
   jpeg_finish_compress(&cinfo);

 longjmp_error:
   jpeg_destroy_compress(&cinfo);

   if (al_is_bitmap_locked(bmp)) {
      al_unlock_bitmap(bmp);
   }

   al_free(data->buffer);
}